

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QLocale __thiscall QLocale::collation(QLocale *this)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSharedDataPointer<QLocalePrivate> in_RDI;
  long in_FS_OFFSET;
  QString res;
  QVariant *in_stack_ffffffffffffff48;
  QSystemLocale *in_stack_ffffffffffffff50;
  QString *name;
  QSharedDataPointer<QLocalePrivate> this_00;
  QString local_48;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr = in_RDI.d.ptr;
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)0x4ddd22);
  if (pQVar2->m_data == &systemLocaleData) {
    in_stack_ffffffffffffff50 = systemLocale();
    name = &local_48;
    ::QVariant::QVariant((QVariant *)0x4ddd66);
    (*in_stack_ffffffffffffff50->_vptr_QSystemLocale[2])
              (local_28,in_stack_ffffffffffffff50,0x21,name);
    ::QVariant::toString(in_stack_ffffffffffffff48);
    ::QVariant::~QVariant((QVariant *)in_stack_ffffffffffffff50);
    ::QVariant::~QVariant((QVariant *)in_stack_ffffffffffffff50);
    bVar1 = QString::isEmpty((QString *)0x4dddbd);
    if (!bVar1) {
      QLocale((QLocale *)this_00.d.ptr,name);
    }
    QString::~QString((QString *)0x4dde4b);
    if (!bVar1) goto LAB_004dde68;
  }
  QLocale((QLocale *)in_stack_ffffffffffffff50,(QLocale *)in_stack_ffffffffffffff48);
LAB_004dde68:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QLocalePrivate>)(QSharedDataPointer<QLocalePrivate>)in_RDI.d.ptr;
}

Assistant:

QLocale QLocale::collation() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::Collation).toString();
        if (!res.isEmpty())
            return QLocale(res);
    }
#endif
    return *this;
}